

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Helper.cpp
# Opt level: O2

vector<char,_std::allocator<char>_> * __thiscall
adios2::format::BP5Helper::BuildNodeContrib
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,BP5Helper *this,
          digest attrHash,size_t attrSize,
          vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          *MMBlocks,size_t MetaEncodeSize,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *WriterDataPositions)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  MetaMetaInfoBlock *MM;
  long lVar4;
  digest D;
  undefined8 local_48;
  undefined8 uStack_40;
  
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar4 = *(long *)(attrSize + 8) - *(long *)attrSize >> 5;
  std::vector<char,_std::allocator<char>_>::resize(__return_storage_ptr__,lVar4 * 0x18 + 0x30);
  pcVar1 = (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *(BP5Helper **)pcVar1 = this;
  *(uint64_t *)(pcVar1 + 8) = attrHash.x[0];
  *(uint64_t *)
   ((__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
    super__Vector_impl_data._M_start + 0x10) = attrHash.x[1];
  *(long *)((__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start + 0x18) = lVar4;
  lVar2 = *(long *)(attrSize + 8);
  lVar3 = 0;
  for (lVar4 = *(long *)attrSize; lVar4 != lVar2; lVar4 = lVar4 + 0x20) {
    local_48 = 0;
    uStack_40 = 0;
    memcpy(&local_48,*(void **)(lVar4 + 0x10),*(size_t *)(lVar4 + 0x18));
    pcVar1 = (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start + lVar3 + 0x20;
    *(undefined8 *)pcVar1 = local_48;
    *(undefined8 *)(pcVar1 + 8) = uStack_40;
    *(ulong *)((__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start + lVar3 + 0x30) =
         *(long *)(lVar4 + 8) + 7U & 0xfffffffffffffff8;
    lVar3 = lVar3 + 0x18;
  }
  *(vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
    **)((__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_start + lVar3 + 0x20) = MMBlocks;
  *(undefined8 *)
   ((__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
    super__Vector_impl_data._M_start + lVar3 + 0x28) = **(undefined8 **)MetaEncodeSize;
  return __return_storage_ptr__;
}

Assistant:

std::vector<char>
BP5Helper::BuildNodeContrib(const digest attrHash, const size_t attrSize,
                            const std::vector<BP5Base::MetaMetaInfoBlock> MMBlocks,
                            const size_t MetaEncodeSize,
                            const std::vector<uint64_t> WriterDataPositions)
{
    std::vector<char> ret;
    size_t MMBlocksSize = MMBlocks.size();
    size_t len = sizeof(digest) + 2 * sizeof(size_t) +
                 MMBlocksSize * (sizeof(size_t) + sizeof(digest)) + sizeof(size_t) +
                 sizeof(uint64_t);
    ret.resize(len);
    size_t position = 0;
    helper::CopyToBuffer(ret, position, (char *)&attrHash.x[0], sizeof(digest));
    helper::CopyToBuffer(ret, position, &attrSize, 1);
    helper::CopyToBuffer(ret, position, &MMBlocksSize, 1);
    for (auto &MM : MMBlocks)
    {
        digest D;
        std::memcpy(&D.x[0], MM.MetaMetaID, MM.MetaMetaIDLen);
        helper::CopyToBuffer(ret, position, (char *)&D.x[0], sizeof(digest));
        size_t AlignedSize = ((MM.MetaMetaInfoLen + 7) & ~0x7);
        helper::CopyToBuffer(ret, position, &AlignedSize, 1);
    }
    helper::CopyToBuffer(ret, position, &MetaEncodeSize, 1);
    helper::CopyToBuffer(ret, position, &WriterDataPositions[0], 1);
    return ret;
}